

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

int64_t duckdb::Timestamp::GetEpochNanoSeconds(timestamp_t timestamp)

{
  bool bVar1;
  ConversionException *this;
  allocator local_41;
  int64_t result;
  string local_38;
  
  bVar1 = TryGetEpochNanoSeconds(timestamp,&result);
  if (bVar1) {
    return result;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Could not convert Timestamp(US) to Timestamp(NS)",&local_41);
  ConversionException::ConversionException(this,&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t Timestamp::GetEpochNanoSeconds(timestamp_t timestamp) {
	int64_t result;
	D_ASSERT(Timestamp::IsFinite(timestamp));
	if (!TryGetEpochNanoSeconds(timestamp, result)) {
		throw ConversionException("Could not convert Timestamp(US) to Timestamp(NS)");
	}
	return result;
}